

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::util_reportModelMPS(HModel *this,char *filename)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  pointer piVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char buff [55];
  ofstream output;
  char local_268 [56];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,filename,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"NAME",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(this->modelName)._M_dataplus._M_p,
                      (this->modelName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," SIZE: N=",9);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->numCol);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",  M=",5);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->numRow);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", NZ=",5);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_268[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_268,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ROWS\n",5);
  if (0 < this->numRow) {
    iVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," E  R",5);
      iVar10 = iVar10 + 1;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    } while (iVar10 < this->numRow);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," N  COST",8);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"COLUMNS\n",8);
  *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 10;
  piVar8 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < piVar8[this->numCol]) {
    bVar5 = true;
    bVar6 = true;
    iVar10 = 0;
    uVar12 = 0;
    do {
      uVar1 = uVar12 + 1;
      if (iVar10 < piVar8[uVar12 + 1]) {
        lVar11 = (long)iVar10;
        do {
          dVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
          bVar5 = !bVar5;
          if (bVar5) {
            sprintf(local_268,"        R%-3d %12f",dVar3,
                    (ulong)((this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar11] + 1));
            sVar9 = strlen(local_268);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,local_268,sVar9);
            std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
            std::ostream::put((char)&local_230);
            std::ostream::flush();
          }
          else {
            sprintf(local_268,"    C%-3d      R%-3d %12f",dVar3,uVar1 & 0xffffffff);
            sVar9 = strlen(local_268);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,local_268,sVar9);
          }
          lVar11 = lVar11 + 1;
          iVar10 = iVar10 + 1;
          bVar6 = bVar5;
        } while (lVar11 < (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar1]);
      }
      if (!bVar6) {
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
        std::ostream::put((char)&local_230);
        bVar5 = true;
        bVar6 = true;
        std::ostream::flush();
      }
      if ((this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] != 0.0) {
        sprintf(local_268,"    C%-3d      COST %12f",uVar1 & 0xffffffff);
        sVar9 = strlen(local_268);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar9);
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
        std::ostream::put((char)&local_230);
        std::ostream::flush();
      }
      piVar8 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = uVar1;
    } while (iVar10 < piVar8[this->numCol]);
  }
  *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"RHS\n",4);
  if (0 < this->numRow) {
    bVar5 = true;
    uVar12 = 0;
    do {
      pdVar2 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar12;
      uVar12 = uVar12 + 1;
      cVar4 = (char)(ostream *)&local_230;
      if (*pdVar2 != 0.0) {
        if (bVar5) {
          sprintf(local_268,"    DEMANDS   R%-3d %12g",uVar12 & 0xffffffff);
          sVar9 = strlen(local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar9);
          bVar5 = false;
        }
        else {
          sprintf(local_268,"        R%-3d %12g",uVar12 & 0xffffffff);
          sVar9 = strlen(local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar9);
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar4);
          std::ostream::put(cVar4);
          bVar5 = true;
          std::ostream::flush();
        }
      }
    } while ((long)uVar12 < (long)this->numRow);
    if (!bVar5) {
      std::ios::widen(cVar4 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"BOUNDS\n",7);
  iVar10 = this->numCol;
  if (0 < iVar10) {
    lVar11 = 0;
    do {
      if ((this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] < 1e+200) {
        sprintf(local_268,"  UP BND     C%-3d %12g\n",(ulong)((int)lVar11 + 1));
        sVar9 = strlen(local_268);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar9);
        iVar10 = this->numCol;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar10);
    if (0 < iVar10) {
      lVar11 = 0;
      do {
        if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] != 0.0) {
          sprintf(local_268,"  LO BND     C%-3d %12g\n",(ulong)((int)lVar11 + 1));
          sVar9 = strlen(local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar9);
          iVar10 = this->numCol;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar10);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ENDATA",6);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void HModel::util_reportModelMPS(const char *filename) {
  ofstream output(filename);
  //COLUMNS are numCol + #constr with upper bound + #constr with lower bound: numColU and numColL
  output<<"NAME"<<"\t"<<modelName<<" SIZE: N="<<numCol<<",  M="<<numRow<<", NZ="<<Aindex.size()<<'\n';	

  output << "ROWS\n";
  for (int i = 1; i <= numRow; i++) {
    output << " E  R"<< i << "\n";
  }
  output << " N  COST"<<endl;
  output <<"COLUMNS\n";
  output << setprecision(10);
  
  char buff [55];
  
  int j=0; //element index
  int k=0; //column index
  bool ll=true;
  while (j<Astart[numCol]) {
    while (j<Astart[k+1]) {
      if (ll) {
	sprintf(buff, "    C%-3d      R%-3d %12f", k+1,  Aindex[j]+1, Avalue[j]);
	output<<buff;
	ll = false;
	j++;
      }
      else {
	sprintf(buff, "        R%-3d %12f", Aindex[j]+1, Avalue[j]);
	output<<buff<<endl;
	ll=true;
	j++;					
      }
    }
    if (!ll) {
      output<<endl;
      ll = true;
    }
    if (fabs(colCost[k])>0) {
      sprintf(buff, "    C%-3d      COST %12f", k+1,  colCost[k]);
      output<<buff<<endl;
    }
    k++;
  }
  
  output << setprecision(10);
  output <<"RHS\n"; //RHS for all cases
  ll = true;
  for (int i=0;i<numRow;i++) 
    if (fabs(rowUpper[i])>0) {
      if (ll) {
	sprintf(buff,"    DEMANDS   R%-3d %12g", i+1, rowUpper[i]);
	output<<buff;
	ll = false;
      }
      else {
	sprintf(buff,"        R%-3d %12g", i+1, rowUpper[i]);
	output<<buff<<endl;
	ll=true;					
      }
    }
  
  
  if (!ll)
    output<<endl;
  //omega and gamma by default have lb 0 and ub infinity, edit in future if needed
  output <<"BOUNDS\n";
  for (int i=0;i<numCol;i++) 
    if (colUpper[i]<HSOL_CONST_INF)  {
      sprintf(buff,"  UP BND     C%-3d %12g\n", i+1, colUpper[i]);
      output<<buff;
    }
  
  
  for (int i=0;i<numCol;i++) 
    if (fabs(colLower[i])>0) {
      sprintf(buff,"  LO BND     C%-3d %12g\n", i+1, colLower[i]);
      output<<buff;
    }
  
  output <<"ENDATA";
  
  output.close();
}